

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O1

RelationStats *
duckdb::RelationStatisticsHelper::ExtractGetStats
          (RelationStats *__return_storage_ptr__,LogicalGet *get,ClientContext *context)

{
  pointer *ppDVar1;
  element_type *peVar2;
  table_statistics_t p_Var3;
  iterator iVar4;
  pointer pbVar5;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var6;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  undefined4 extraout_var;
  vector<duckdb::ColumnIndex,_true> *this;
  const_reference pvVar12;
  pointer this_00;
  idx_t iVar13;
  __uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  *p_Var14;
  long *plVar15;
  type filter;
  type base_stats;
  pointer pTVar16;
  _Base_ptr p_Var17;
  ulong uVar18;
  _Alloc_hider *p_Var19;
  __uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  _Var20;
  byte bVar21;
  bool bVar22;
  element_type *peVar23;
  size_type __n;
  double dVar24;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  column_statistics;
  string column_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  optional_ptr<duckdb::TableCatalogEntry,_true> catalog_table;
  DistinctCount column_distinct_count;
  string name;
  DistinctCount column_distinct_count_1;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_110;
  idx_t local_108;
  undefined1 local_100 [32];
  _Rb_tree_node_base *local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  long lStack_a8;
  _Alloc_hider local_a0;
  size_type sStack_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  TableCatalogEntry *local_68;
  DistinctCount local_60;
  __node_base *local_50 [2];
  __node_base local_40 [2];
  
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->cardinality = 1;
  __return_storage_ptr__->filter_strength = 1.0;
  __return_storage_ptr__->stats_initialized = false;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  local_90._0_8_ = context;
  iVar11 = (*(get->super_LogicalOperator)._vptr_LogicalOperator[7])(get,context);
  local_108 = CONCAT44(extraout_var,iVar11);
  local_110._M_head_impl = (BaseStatistics *)0x0;
  local_b8._0_8_ = LogicalGet::GetTable(get);
  local_90._8_8_ = local_80._M_local_buf + 8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_90 + 8),"some table","");
  if ((TableCatalogEntry *)local_b8._0_8_ != (TableCatalogEntry *)0x0) {
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_b8);
    ::std::__cxx11::string::_M_assign((string *)(local_90 + 8));
    ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->table_name);
  }
  local_68 = (TableCatalogEntry *)LogicalGet::GetTable(get);
  this = LogicalGet::GetColumnIds(get);
  if ((this->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_e0 = (_Rb_tree_node_base *)&__return_storage_ptr__->column_names;
    peVar2 = (element_type *)(local_100 + 0x10);
    __n = 0;
    do {
      pvVar12 = vector<duckdb::ColumnIndex,_true>::operator[](this,__n);
      uVar18 = pvVar12->index;
      p_Var3 = (get->function).statistics;
      if (p_Var3 == (table_statistics_t)0x0) {
LAB_00d22eea:
        local_60.distinct_count = local_108;
        iVar13 = local_60.distinct_count;
        local_60._8_4_ = local_60._8_4_ & 0xffffff00;
        iVar4._M_current =
             (__return_storage_ptr__->column_distinct_count).
             super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->column_distinct_count).
            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>>::
          _M_realloc_insert<duckdb::DistinctCount_const&>
                    ((vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>> *)
                     __return_storage_ptr__,iVar4,&local_60);
        }
        else {
          local_60.distinct_count._0_4_ = (float)local_108;
          local_60.distinct_count._4_4_ = (undefined4)(local_108 >> 0x20);
          *(float *)&(iVar4._M_current)->distinct_count = (float)local_60.distinct_count;
          *(undefined4 *)((long)&(iVar4._M_current)->distinct_count + 4) =
               local_60.distinct_count._4_4_;
          (iVar4._M_current)->from_hll = local_60.from_hll;
          *(undefined3 *)&(iVar4._M_current)->field_0x9 = local_60._9_3_;
          *(undefined4 *)&(iVar4._M_current)->field_0xc = local_60._12_4_;
          ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
          local_60.distinct_count = iVar13;
        }
        local_100._0_8_ = peVar2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"column","");
        if (uVar18 < (ulong)((long)(get->names).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(get->names).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          ::std::__cxx11::string::_M_assign((string *)local_100);
        }
        (*(get->super_LogicalOperator)._vptr_LogicalOperator[3])(local_50,get);
        plVar15 = (long *)::std::__cxx11::string::append((char *)local_50);
        local_b8._8_8_ = &local_a0;
        p_Var19 = (_Alloc_hider *)(plVar15 + 2);
        if ((_Alloc_hider *)*plVar15 == p_Var19) {
          local_a0._M_p = p_Var19->_M_p;
          sStack_98 = plVar15[3];
        }
        else {
          local_a0._M_p = p_Var19->_M_p;
          local_b8._8_8_ = (_Alloc_hider *)*plVar15;
        }
        lStack_a8 = plVar15[1];
        *plVar15 = (long)p_Var19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        p_Var14 = (__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                   *)::std::__cxx11::string::_M_append(local_b8 + 8,local_100._0_8_);
        local_d8._0_8_ = (long)local_d8 + 0x10;
        _Var20._M_t.
        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
             (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              )(p_Var14 + 2);
        if ((_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
             )p_Var14->_M_t ==
            (_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
             )_Var20._M_t.
              super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl) {
          local_d8._16_8_ =
               *(undefined8 *)
                _Var20._M_t.
                super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
          local_d8._24_8_ = p_Var14[3]._M_t;
        }
        else {
          local_d8._16_8_ =
               *(undefined8 *)
                _Var20._M_t.
                super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
          local_d8._0_8_ =
               (_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                )p_Var14->_M_t;
        }
        local_d8._8_8_ = p_Var14[1]._M_t;
        p_Var14->_M_t =
             _Var20._M_t.
             super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
             .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
        p_Var14[1]._M_t =
             (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              )0x0;
        *(undefined1 *)&p_Var14[2]._M_t = 0;
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        if ((_Alloc_hider *)local_b8._8_8_ != &local_a0) {
          operator_delete((void *)local_b8._8_8_);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        peVar23 = (element_type *)local_100._0_8_;
        if ((element_type *)local_100._0_8_ != peVar2) {
LAB_00d2309b:
          operator_delete(peVar23);
        }
      }
      else {
        (*p_Var3)((ClientContext *)local_100,(FunctionData *)local_90._0_8_,
                  (column_t)
                  (get->bind_data).
                  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                  .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
        uVar8 = local_100._0_8_;
        _Var7._M_head_impl = local_110._M_head_impl;
        local_100._0_8_ = (element_type *)0x0;
        local_110._M_head_impl = (BaseStatistics *)uVar8;
        if ((element_type *)_Var7._M_head_impl != (element_type *)0x0) {
          BaseStatistics::~BaseStatistics(_Var7._M_head_impl);
          operator_delete(_Var7._M_head_impl);
        }
        uVar8 = local_100._0_8_;
        if ((element_type *)local_100._0_8_ != (element_type *)0x0) {
          BaseStatistics::~BaseStatistics((BaseStatistics *)local_100._0_8_);
          operator_delete((void *)uVar8);
        }
        if ((local_68 == (TableCatalogEntry *)0x0) ||
           ((element_type *)local_110._M_head_impl == (element_type *)0x0)) goto LAB_00d22eea;
        this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                *)&local_110);
        iVar13 = BaseStatistics::GetDistinctCount(this_00);
        lVar9 = lStack_a8;
        local_b8._8_8_ = iVar13 + (iVar13 == 0);
        lStack_a8 = CONCAT71(lStack_a8._1_7_,1);
        lVar10 = lStack_a8;
        iVar4._M_current =
             (__return_storage_ptr__->column_distinct_count).
             super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->column_distinct_count).
            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>>::
          _M_realloc_insert<duckdb::DistinctCount_const&>
                    ((vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>> *)
                     __return_storage_ptr__,iVar4,(DistinctCount *)(local_b8 + 8));
        }
        else {
          lStack_a8._4_4_ = SUB84(lVar9,4);
          (iVar4._M_current)->distinct_count = local_b8._8_8_;
          (iVar4._M_current)->from_hll = lStack_a8._0_1_;
          (iVar4._M_current)->field_0x9 = lStack_a8._1_1_;
          (iVar4._M_current)->field_0xa = lStack_a8._2_1_;
          (iVar4._M_current)->field_0xb = lStack_a8._3_1_;
          *(undefined4 *)&(iVar4._M_current)->field_0xc = lStack_a8._4_4_;
          ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
          lStack_a8 = lVar10;
        }
        local_d8._0_8_ = (long)local_d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,local_90._8_8_,
                   (char *)(local_80._M_allocated_capacity + local_90._8_8_));
        ::std::__cxx11::string::append((char *)local_d8);
        pbVar5 = (get->names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(get->names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) <= uVar18)
        {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar18);
        }
        plVar15 = (long *)::std::__cxx11::string::_M_append
                                    (local_d8,(ulong)pbVar5[uVar18]._M_dataplus._M_p);
        peVar23 = (element_type *)(plVar15 + 2);
        if ((element_type *)*plVar15 == peVar23) {
          local_100._16_8_ =
               *(undefined8 *)&peVar23->super_enable_shared_from_this<duckdb::ClientContext>;
          local_100._24_8_ = plVar15[3];
          local_100._0_8_ = peVar2;
        }
        else {
          local_100._16_8_ =
               *(undefined8 *)&peVar23->super_enable_shared_from_this<duckdb::ClientContext>;
          local_100._0_8_ = (element_type *)*plVar15;
        }
        local_100._8_8_ = plVar15[1];
        *plVar15 = (long)peVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
        if ((element_type *)local_100._0_8_ != peVar2) {
          operator_delete((void *)local_100._0_8_);
        }
        peVar23 = (element_type *)local_d8._0_8_;
        if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) goto LAB_00d2309b;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->
                                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  _Var7._M_head_impl = local_110._M_head_impl;
  iVar13 = local_108;
  if ((get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_110._M_head_impl = (BaseStatistics *)0x0;
    if ((element_type *)_Var7._M_head_impl != (element_type *)0x0) {
      BaseStatistics::~BaseStatistics(_Var7._M_head_impl);
      operator_delete(_Var7._M_head_impl);
    }
    p_Var17 = (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e0 = &(get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar18 = local_108;
    if (p_Var17 == local_e0) {
      bVar22 = true;
    }
    else {
      bVar21 = 0;
      do {
        _Var6._M_head_impl =
             (get->bind_data).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
        if ((_Var6._M_head_impl != (FunctionData *)0x0) &&
           (p_Var3 = (get->function).statistics, p_Var3 != (table_statistics_t)0x0)) {
          (*p_Var3)((ClientContext *)local_100,(FunctionData *)local_90._0_8_,
                    (column_t)_Var6._M_head_impl);
          uVar8 = local_100._0_8_;
          _Var7._M_head_impl = local_110._M_head_impl;
          local_100._0_8_ = (element_type *)0x0;
          local_110._M_head_impl = (BaseStatistics *)uVar8;
          if ((element_type *)_Var7._M_head_impl != (element_type *)0x0) {
            BaseStatistics::~BaseStatistics(_Var7._M_head_impl);
            operator_delete(_Var7._M_head_impl);
          }
          uVar8 = local_100._0_8_;
          if ((element_type *)local_100._0_8_ != (element_type *)0x0) {
            BaseStatistics::~BaseStatistics((BaseStatistics *)local_100._0_8_);
            operator_delete((void *)uVar8);
          }
        }
        if ((element_type *)local_110._M_head_impl != (element_type *)0x0) {
          iVar13 = *(idx_t *)(p_Var17 + 1);
          filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                   operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                              *)&p_Var17[1]._M_parent);
          base_stats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                    *)&local_110);
          iVar13 = InspectTableFilter(local_108,iVar13,filter,base_stats);
          if (iVar13 <= uVar18) {
            uVar18 = iVar13;
          }
        }
        pTVar16 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                              *)&p_Var17[1]._M_parent);
        if (pTVar16->filter_type != OPTIONAL_FILTER) {
          bVar21 = 1;
        }
        p_Var17 = (_Base_ptr)::std::_Rb_tree_increment(p_Var17);
      } while (p_Var17 != local_e0);
      bVar22 = (bool)(bVar21 ^ 1);
    }
    if ((uVar18 == local_108) && (!bVar22)) {
      dVar24 = (((double)CONCAT44(0x45300000,(int)(local_108 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_108) - 4503599627370496.0)) * 0.2;
      uVar18 = (ulong)dVar24;
      uVar18 = (long)(dVar24 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18;
      uVar18 = uVar18 + (uVar18 == 0);
    }
    iVar13 = local_108;
    if (local_108 != 0) {
      iVar13 = uVar18;
    }
  }
  __return_storage_ptr__->cardinality = iVar13;
  (get->super_LogicalOperator).estimated_cardinality = iVar13;
  (get->super_LogicalOperator).has_estimated_cardinality = true;
  __return_storage_ptr__->stats_initialized = true;
  if ((char *)local_90._8_8_ != local_80._M_local_buf + 8) {
    operator_delete((void *)local_90._8_8_);
  }
  _Var7._M_head_impl = local_110._M_head_impl;
  if ((element_type *)local_110._M_head_impl != (element_type *)0x0) {
    BaseStatistics::~BaseStatistics(local_110._M_head_impl);
    operator_delete(_Var7._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractGetStats(LogicalGet &get, ClientContext &context) {
	auto return_stats = RelationStats();

	auto base_table_cardinality = get.EstimateCardinality(context);
	auto cardinality_after_filters = base_table_cardinality;
	unique_ptr<BaseStatistics> column_statistics;

	auto catalog_table = get.GetTable();
	auto name = string("some table");
	if (catalog_table) {
		name = catalog_table->name;
		return_stats.table_name = name;
	}

	// if we can get the catalog table, then our column statistics will be accurate
	// parquet readers etc. will still return statistics, but they initialize distinct column
	// counts to 0.
	// TODO: fix this, some file formats can encode distinct counts, we don't want to rely on
	//  getting a catalog table to know that we can use statistics.
	bool have_catalog_table_statistics = false;
	if (get.GetTable()) {
		have_catalog_table_statistics = true;
	}

	// first push back basic distinct counts for each column (if we have them).
	auto &column_ids = get.GetColumnIds();
	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto column_id = column_ids[i].GetPrimaryIndex();
		bool have_distinct_count_stats = false;
		if (get.function.statistics) {
			column_statistics = get.function.statistics(context, get.bind_data.get(), column_id);
			if (column_statistics && have_catalog_table_statistics) {
				auto distinct_count = MaxValue<idx_t>(1, column_statistics->GetDistinctCount());
				auto column_distinct_count = DistinctCount({distinct_count, true});
				return_stats.column_distinct_count.push_back(column_distinct_count);
				return_stats.column_names.push_back(name + "." + get.names.at(column_id));
				have_distinct_count_stats = true;
			}
		}
		if (!have_distinct_count_stats) {
			// currently treating the cardinality as the distinct count.
			// the cardinality estimator will update these distinct counts based
			// on the extra columns that are joined on.
			auto column_distinct_count = DistinctCount({cardinality_after_filters, false});
			return_stats.column_distinct_count.push_back(column_distinct_count);
			auto column_name = string("column");
			if (column_id < get.names.size()) {
				column_name = get.names.at(column_id);
			}
			return_stats.column_names.push_back(get.GetName() + "." + column_name);
		}
	}

	if (!get.table_filters.filters.empty()) {
		column_statistics = nullptr;
		bool has_non_optional_filters = false;
		for (auto &it : get.table_filters.filters) {
			if (get.bind_data && get.function.statistics) {
				column_statistics = get.function.statistics(context, get.bind_data.get(), it.first);
			}

			if (column_statistics) {
				idx_t cardinality_with_filter =
				    InspectTableFilter(base_table_cardinality, it.first, *it.second, *column_statistics);
				cardinality_after_filters = MinValue(cardinality_after_filters, cardinality_with_filter);
			}

			if (it.second->filter_type != TableFilterType::OPTIONAL_FILTER) {
				has_non_optional_filters = true;
			}
		}
		// if the above code didn't find an equality filter (i.e country_code = "[us]")
		// and there are other table filters (i.e cost > 50), use default selectivity.
		bool has_equality_filter = (cardinality_after_filters != base_table_cardinality);
		if (!has_equality_filter && has_non_optional_filters) {
			cardinality_after_filters = MaxValue<idx_t>(
			    LossyNumericCast<idx_t>(double(base_table_cardinality) * RelationStatisticsHelper::DEFAULT_SELECTIVITY),
			    1U);
		}
		if (base_table_cardinality == 0) {
			cardinality_after_filters = 0;
		}
	}
	return_stats.cardinality = cardinality_after_filters;
	// update the estimated cardinality of the get as well.
	// This is not updated during plan reconstruction.
	get.estimated_cardinality = cardinality_after_filters;
	get.has_estimated_cardinality = true;
	D_ASSERT(base_table_cardinality >= cardinality_after_filters);
	return_stats.stats_initialized = true;
	return return_stats;
}